

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O2

void __thiscall
duckdb::ScanFilter::ScanFilter
          (ScanFilter *this,ClientContext *context,idx_t index,
          vector<duckdb::StorageIndex,_true> *column_ids,TableFilter *filter)

{
  _Head_base<0UL,_duckdb::TableFilterState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TableFilterState_*,_false> _Var2;
  const_reference pvVar3;
  _Head_base<0UL,_duckdb::TableFilterState_*,_false> local_20;
  
  this->scan_column_index = index;
  pvVar3 = vector<duckdb::StorageIndex,_true>::get<true>(column_ids,index);
  this->table_column_index = pvVar3->index;
  this->filter = filter;
  this->always_true = false;
  (this->filter_state).
  super_unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilterState_*,_std::default_delete<duckdb::TableFilterState>_>
  .super__Head_base<0UL,_duckdb::TableFilterState_*,_false>._M_head_impl = (TableFilterState *)0x0;
  TableFilterState::Initialize((TableFilterState *)&local_20,context,filter);
  _Var2._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (TableFilterState *)0x0;
  _Var1._M_head_impl =
       (this->filter_state).
       super_unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TableFilterState_*,_std::default_delete<duckdb::TableFilterState>_>
       .super__Head_base<0UL,_duckdb::TableFilterState_*,_false>._M_head_impl;
  (this->filter_state).
  super_unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilterState_*,_std::default_delete<duckdb::TableFilterState>_>
  .super__Head_base<0UL,_duckdb::TableFilterState_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (TableFilterState *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_TableFilterState[1])();
    if (local_20._M_head_impl != (TableFilterState *)0x0) {
      (*(local_20._M_head_impl)->_vptr_TableFilterState[1])();
    }
  }
  return;
}

Assistant:

ScanFilter::ScanFilter(ClientContext &context, idx_t index, const vector<StorageIndex> &column_ids, TableFilter &filter)
    : scan_column_index(index), table_column_index(column_ids[index].GetPrimaryIndex()), filter(filter),
      always_true(false) {
	filter_state = TableFilterState::Initialize(context, filter);
}